

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O3

EStatusCode __thiscall Type1Input::ParseCharstrings(Type1Input *this)

{
  InputPFBDecodeStream *this_00;
  bool bVar1;
  int iVar2;
  EStatusCode EVar3;
  Byte *inBuffer;
  STDStreamsReader<int> reader;
  BoolAndString token;
  string characterName;
  STDStreamsReader<int> local_109;
  undefined1 local_108 [8];
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  int local_e0;
  int local_d4;
  Type1Input *local_d0;
  char local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  BoolAndString local_80;
  BoolAndString local_58;
  
  local_c8 = '\0';
  local_c0 = &local_b0;
  local_b8 = 0;
  local_b0 = 0;
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  this_00 = &this->mPFBDecoder;
  local_d0 = this;
  do {
    bVar1 = InputPFBDecodeStream::NotEnded(this_00);
    if (!bVar1) break;
    InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_108,this_00);
    local_c8 = local_108[0];
    std::__cxx11::string::operator=((string *)&local_c0,(string *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ != &local_f0) {
      operator_delete((void *)local_100._0_8_,local_f0._M_allocated_capacity + 1);
    }
    if (local_c8 != '\x01') break;
    iVar2 = std::__cxx11::string::compare((char *)&local_c0);
  } while (iVar2 != 0);
  EVar3 = eFailure;
  if (local_c8 == '\x01') {
    local_d0 = (Type1Input *)&local_d0->mCharStrings;
    do {
      EVar3 = InputPFBDecodeStream::GetInternalState(this_00);
      if (EVar3 != eSuccess) break;
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_108,this_00);
      local_c8 = local_108[0];
      std::__cxx11::string::operator=((string *)&local_c0,(string *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != &local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0._M_allocated_capacity + 1);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar2 == 0) break;
      std::__cxx11::string::substr((ulong)local_108,(ulong)&local_c0);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)local_108);
      if (local_108 != (undefined1  [8])(local_100 + 8)) {
        operator_delete((void *)local_108,local_100._8_8_ + 1);
      }
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_108,this_00);
      STDStreamsReader<int>::Read(&local_109,(string *)local_100,&local_d4);
      iVar2 = local_d4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != &local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0._M_allocated_capacity + 1);
      }
      inBuffer = (Byte *)operator_new__((long)iVar2);
      InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_58,this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
        operator_delete(local_58.second._M_dataplus._M_p,
                        local_58.second.field_2._M_allocated_capacity + 1);
      }
      InputPFBDecodeStream::Read(this_00,inBuffer,(long)iVar2);
      local_108 = (undefined1  [8])(local_100 + 8);
      std::__cxx11::string::_M_construct<char*>((string *)local_108,local_a0,local_a0 + local_98);
      local_e0 = iVar2;
      local_f0._8_8_ = inBuffer;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type1CharString>,std::_Select1st<std::pair<std::__cxx11::string_const,Type1CharString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type1CharString>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Type1CharString>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type1CharString>,std::_Select1st<std::pair<std::__cxx11::string_const,Type1CharString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type1CharString>>>
                  *)local_d0,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>
                  *)local_108);
      if (local_108 != (undefined1  [8])(local_100 + 8)) {
        operator_delete((void *)local_108,local_100._8_8_ + 1);
      }
      InputPFBDecodeStream::GetNextToken_abi_cxx11_(&local_80,this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.second._M_dataplus._M_p != &local_80.second.field_2) {
        operator_delete(local_80.second._M_dataplus._M_p,
                        local_80.second.field_2._M_allocated_capacity + 1);
      }
    } while (local_c8 != '\0');
    EVar3 = InputPFBDecodeStream::GetInternalState(this_00);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return EVar3;
}

Assistant:

EStatusCode Type1Input::ParseCharstrings()
{
	BoolAndString token;
	std::string characterName;
	Type1CharString charString;

	// skip till "begin"
	while(mPFBDecoder.NotEnded())
	{
		token = mPFBDecoder.GetNextToken();
		if(!token.first || token.second.compare("begin") == 0)
			break;
	}
	if(!token.first)
		return eFailure;

	// Charstrings look like this:
	// charactername nbytes RD ~n~binary~bytes~ ND
	while(token.first && mPFBDecoder.GetInternalState() == eSuccess)
	{
		token = mPFBDecoder.GetNextToken();

		if("end" == token.second)
			break;

		characterName = FromPSName(token.second);

		charString.CodeLength = Int(mPFBDecoder.GetNextToken().second);

		charString.Code = new Byte[charString.CodeLength];

		// skip the RD token (will also skip space)
		mPFBDecoder.GetNextToken();


		mPFBDecoder.Read(charString.Code,charString.CodeLength);

		mCharStrings.insert(StringToType1CharStringMap::value_type(characterName,charString));

		// skip ND token
		mPFBDecoder.GetNextToken();
	}

	return mPFBDecoder.GetInternalState();
}